

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O2

void __thiscall Test_aistr_assign_Test::TestBody(Test_aistr_assign_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char buf [10];
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::assign<10ul>(&buf,(char *)0x0);
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x45,
             "Expected: ai::assign(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_38);
  ai::assign<10ul>(&buf,"1234");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,buf,(allocator<char> *)&local_50);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&gtest_ar,"std::string(buf)","\"1234\"",&local_38,(char (*) [5])0x126fe5);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    ai::assign<10ul>(&buf,"");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,buf,(allocator<char> *)&local_50);
    pcVar2 = "";
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
              ((internal *)&gtest_ar,"std::string(buf)","\"\"",&local_38,(char (*) [1])0x128d29);
    std::__cxx11::string::~string((string *)&local_38);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x4a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      ai::assign<10ul>(&buf,"123456789");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,buf,(allocator<char> *)&local_50);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                ((internal *)&gtest_ar,"std::string(buf)","\"123456789\"",&local_38,
                 (char (*) [10])"123456789");
      std::__cxx11::string::~string((string *)&local_38);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        ai::assign<10ul>(&buf,"12345678901");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,buf,(allocator<char> *)&local_50);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                  ((internal *)&gtest_ar,"std::string(buf)","\"123456789\"",&local_38,
                   (char (*) [10])"123456789");
        std::__cxx11::string::~string((string *)&local_38);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_38);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x50,pcVar2);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_38);
        }
        goto LAB_0010dae3;
      }
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x4d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_38);
LAB_0010dae3:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(Test_aistr, assign) {
    char buf[10] = {0};

    EXPECT_THROW(ai::assign(buf, nullptr), std::invalid_argument);

    ai::assign(buf, "1234");
    ASSERT_EQ(std::string(buf), "1234");
    ai::assign(buf, "");
    ASSERT_EQ(std::string(buf), "");

    ai::assign(buf, "123456789");
    ASSERT_EQ(std::string(buf), "123456789");

    ai::assign(buf, "12345678901");
    ASSERT_EQ(std::string(buf), "123456789");
}